

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

TaprootBuilder * __thiscall TaprootBuilder::AddOmitted(TaprootBuilder *this,int depth,uint256 *hash)

{
  long lVar1;
  bool bVar2;
  NodeInfo *in_RDX;
  undefined4 in_ESI;
  TaprootBuilder *in_RDI;
  long in_FS_OFFSET;
  NodeInfo node;
  TaprootBuilder *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsValid(in_stack_ffffffffffffff68);
  if (bVar2) {
    NodeInfo::NodeInfo((NodeInfo *)in_stack_ffffffffffffff68);
    Insert((TaprootBuilder *)CONCAT44(in_ESI,in_stack_ffffffffffffffa0),in_RDX,
           in_stack_ffffffffffffff94);
    NodeInfo::~NodeInfo((NodeInfo *)in_stack_ffffffffffffff68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

TaprootBuilder& TaprootBuilder::AddOmitted(int depth, const uint256& hash)
{
    if (!IsValid()) return *this;
    /* Construct NodeInfo object with the hash directly, and insert it into the branch. */
    NodeInfo node;
    node.hash = hash;
    Insert(std::move(node), depth);
    return *this;
}